

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

_Bool ts_node_child_iterator_next(NodeChildIterator *self,TSNode *result)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  SubtreeHeapData *pSVar5;
  Subtree *pSVar6;
  uint uVar8;
  undefined4 uVar9;
  TSTree *pTVar7;
  undefined4 uVar10;
  undefined4 uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar16;
  ulong uVar15;
  uint32_t uVar17;
  ulong uVar18;
  undefined4 uStack_34;
  Length result_1;
  undefined4 uStack_14;
  
  pSVar5 = (self->parent).ptr;
  if ((pSVar5 != (SubtreeHeapData *)0x0) &&
     (uVar14 = (ulong)self->child_index, self->child_index != pSVar5->child_count)) {
    pSVar6 = (pSVar5->field_17).field_0.children;
    pSVar5 = pSVar6[uVar14].ptr;
    if (((ulong)pSVar5 & 1) == 0) {
      uVar1 = *(uint *)&pSVar5->field_0x2c >> 2;
    }
    else {
      uVar1 = (uint)((ulong)pSVar5 >> 3) & 0x1fffffff;
    }
    uVar13 = 0;
    if ((uVar1 & 1) == 0) {
      if (self->alias_sequence == (TSSymbol *)0x0) {
        uVar13 = 0;
      }
      else {
        uVar13 = (uint)self->alias_sequence[self->structural_child_index];
      }
      self->structural_child_index = self->structural_child_index + 1;
    }
    pSVar6 = pSVar6 + uVar14;
    if (uVar14 != 0) {
      pSVar5 = pSVar6->ptr;
      if (((ulong)pSVar5 & 1) == 0) {
        uVar1 = (pSVar5->padding).bytes;
        uVar8 = (pSVar5->padding).extent.row;
        uVar17 = (pSVar5->padding).extent.column;
      }
      else {
        uVar1 = (uint)((ulong)pSVar5 >> 0x10) & 0xff;
        uVar12 = (uint)((ulong)pSVar5 >> 0x20);
        uVar8 = uVar12 >> 8 & 0xf;
        uVar17 = uVar12 & 0xff;
      }
      uVar2 = (self->position).bytes;
      uVar9 = (self->position).extent.row;
      uVar18 = CONCAT44((self->position).extent.column,uVar9) + CONCAT44(uVar17,uVar8);
      uVar14 = uVar18 & 0xffffffff | (ulong)uVar17 << 0x20;
      if (uVar8 == 0) {
        uVar14 = uVar18;
      }
      uStack_34 = (undefined4)uVar14;
      result_1.bytes = (uint32_t)(uVar14 >> 0x20);
      (self->position).bytes = uVar1 + uVar2;
      (self->position).extent.row = uStack_34;
      (self->position).extent.column = result_1.bytes;
    }
    pTVar7 = self->tree;
    uVar3 = (self->position).bytes;
    uVar10 = (self->position).extent.row;
    uVar17 = (self->position).extent.column;
    result->context[0] = uVar3;
    result->context[1] = uVar10;
    result->context[2] = uVar17;
    result->context[3] = uVar13;
    result->id = pSVar6;
    result->tree = pTVar7;
    pSVar5 = pSVar6->ptr;
    if (((ulong)pSVar5 & 1) == 0) {
      uVar14._0_4_ = (pSVar5->size).bytes;
      uVar14._4_4_ = (pSVar5->size).extent.row;
      uVar1 = (pSVar5->size).extent.column;
      iVar16 = uVar14._4_4_;
    }
    else {
      uVar14 = (ulong)pSVar5 >> 0x18 & 0xff;
      uVar1 = (uint)uVar14;
      iVar16 = 0;
    }
    uVar4 = (self->position).bytes;
    uVar11 = (self->position).extent.row;
    uVar15 = CONCAT44((self->position).extent.column,uVar11) + CONCAT44(uVar1,iVar16);
    uVar18 = uVar15 & 0xffffffff | (ulong)uVar1 << 0x20;
    if (iVar16 == 0) {
      uVar18 = uVar15;
    }
    uStack_34 = (undefined4)uVar18;
    result_1.bytes = (uint32_t)(uVar18 >> 0x20);
    (self->position).bytes = (int)uVar14 + uVar4;
    (self->position).extent.row = uStack_34;
    (self->position).extent.column = result_1.bytes;
    self->child_index = self->child_index + 1;
    return true;
  }
  return false;
}

Assistant:

static inline bool ts_node_child_iterator_next(NodeChildIterator *self, TSNode *result) {
  if (!self->parent.ptr || self->child_index == self->parent.ptr->child_count) return false;
  const Subtree *child = &self->parent.ptr->children[self->child_index];
  TSSymbol alias_symbol = 0;
  if (!ts_subtree_extra(*child)) {
    if (self->alias_sequence) {
      alias_symbol = self->alias_sequence[self->structural_child_index];
    }
    self->structural_child_index++;
  }
  if (self->child_index > 0) {
    self->position = length_add(self->position, ts_subtree_padding(*child));
  }
  *result = ts_node_new(
    self->tree,
    child,
    self->position,
    alias_symbol
  );
  self->position = length_add(self->position, ts_subtree_size(*child));
  self->child_index++;
  return true;
}